

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O0

void __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenerateStructGetters
          (KotlinKMPGenerator *this,StructDef *struct_def,CodeWriter *writer)

{
  FieldDef *s;
  StructDef *pSVar1;
  pointer ppFVar2;
  bool bVar3;
  bool bVar4;
  reference ppFVar5;
  unsigned_long local_c88;
  anon_class_24_3_5f35eaae local_b28;
  function<void_()> local_b10;
  allocator<char> local_ae9;
  string local_ae8;
  allocator<char> local_ac1;
  string local_ac0;
  allocator<char> local_a99;
  string local_a98;
  allocator<char> local_a71;
  string local_a70;
  anon_class_16_2_97156e7b local_a50;
  function<void_()> local_a40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a00;
  anon_class_24_3_47cc0641 local_9e0;
  function<void_()> local_9c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_988;
  undefined1 local_968 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> nested_method_name;
  string local_940;
  undefined1 local_920 [8];
  string nested_type_name;
  function<void_()> local_8f0;
  allocator<char> local_8c9;
  string local_8c8;
  allocator<char> local_8a1;
  string local_8a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_880;
  Type local_860;
  undefined1 local_840 [8];
  string end_idx;
  anon_class_24_3_aa68e553 local_800;
  function<void_()> local_7e8;
  string local_7c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  undefined1 local_768 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> param2;
  function<void_()> local_730;
  undefined1 local_710 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> rtype;
  undefined1 local_6d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_1;
  string local_6a8;
  undefined1 local_688 [8];
  string name;
  string local_660;
  undefined1 local_640 [8];
  string qualified_name;
  FieldDef *kfield;
  __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_610;
  iterator kit;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *fields;
  StructDef *sd;
  string *local_5f0;
  function<void_()> local_5e8;
  allocator<char> local_5c1;
  string local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  anon_class_24_3_8247fe50 local_580;
  function<void_()> local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  anon_class_24_3_6239dc46 local_528;
  function<void_()> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  allocator<char> local_4a9;
  undefined1 local_4a8 [8];
  string params;
  Type vectortype;
  function<void_()> local_458;
  anon_class_24_3_3a33afe5 local_438;
  function<void_()> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  anon_class_8_1_72ac95b1 local_3e0;
  function<void_()> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  anon_class_32_4_eefdf39f local_398;
  function<void_()> local_378;
  anon_class_24_3_d986f876 local_358;
  function<void_()> local_340;
  anon_class_8_1_72ac95b1 local_320;
  function<void_()> local_318;
  allocator<char> local_2f1;
  string local_2f0;
  anon_class_8_1_72ac95b1 local_2d0;
  function<void_()> local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  allocator<char> local_229;
  string local_228;
  allocator<char> local_201;
  string local_200;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  BaseType local_194;
  undefined1 local_190 [4];
  BaseType value_base_type;
  undefined1 local_170 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> offset_prefix;
  string offset_val;
  string local_128;
  undefined1 local_108 [8];
  string bbgetter;
  string return_type;
  string field_default_value;
  string field_type;
  string field_name;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_48;
  iterator it;
  FieldDef *key_field;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> fields_vec;
  CodeWriter *writer_local;
  StructDef *struct_def_local;
  KotlinKMPGenerator *this_local;
  
  fields_vec.super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)writer;
  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::vector
            ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)&key_field
             ,&(struct_def->fields).vec);
  it._M_current = (FieldDef **)0x0;
  local_48._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                  &key_field);
  do {
    field = (FieldDef *)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                       &key_field);
    bVar3 = __gnu_cxx::operator!=
                      (&local_48,
                       (__normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field);
    ppFVar2 = fields_vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (!bVar3) {
      if (((struct_def->has_key & 1U) != 0) && ((struct_def->fixed & 1U) == 0)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a98,"keysCompare",&local_a99);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ac0,"o1: Offset<*>, o2: Offset<*>, buffer: ReadWriteBuffer",
                   &local_ac1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_ae8,"Int",&local_ae9);
        local_b28.key_field = (FieldDef **)&it;
        local_b28.writer =
             (CodeWriter *)
             fields_vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_b28.this = this;
        std::function<void()>::
        function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_16_,void>
                  ((function<void()> *)&local_b10,&local_b28);
        GenerateOverrideFun((CodeWriter *)ppFVar2,&local_a98,&local_ac0,&local_ae8,&local_b10);
        std::function<void_()>::~function(&local_b10);
        std::__cxx11::string::~string((string *)&local_ae8);
        std::allocator<char>::~allocator(&local_ae9);
        std::__cxx11::string::~string((string *)&local_ac0);
        std::allocator<char>::~allocator(&local_ac1);
        std::__cxx11::string::~string((string *)&local_a98);
        std::allocator<char>::~allocator(&local_a99);
      }
      std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::~vector
                ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                 &key_field);
      return;
    }
    ppFVar5 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_48);
    s = *ppFVar5;
    if ((s->deprecated & 1U) == 0) {
      if ((s->key & 1U) != 0) {
        it._M_current = (FieldDef **)s;
      }
      GenerateComment(this,&(s->super_Definition).doc_comment,
                      (CodeWriter *)
                      fields_vec.
                      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (CommentConfig *)(anonymous_namespace)::comment_config);
      IdlNamer::Field_abi_cxx11_((string *)((long)&field_type.field_2 + 8),&this->namer_,s);
      GenTypeGet_abi_cxx11_
                ((string *)((long)&field_default_value.field_2 + 8),this,&(s->value).type);
      GenDefaultValue_abi_cxx11_((string *)((long)&return_type.field_2 + 8),this,s);
      GetterReturnType_abi_cxx11_((string *)((long)&bbgetter.field_2 + 8),this,s);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_128,"bb",
                 (allocator<char> *)(offset_val.field_2._M_local_buf + 0xf));
      ByteBufferGetter((string *)local_108,this,&(s->value).type,&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      std::allocator<char>::~allocator((allocator<char> *)(offset_val.field_2._M_local_buf + 0xf));
      NumToString<unsigned_short>((string *)((long)&offset_prefix.field_2 + 8),(s->value).offset);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190,
                     "val o = offset(",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&offset_prefix.field_2 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190,
                     "); return o != 0 ? ");
      std::__cxx11::string::~string((string *)local_190);
      ppFVar2 = fields_vec.
                super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_194 = (s->value).type.base_type;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"offset",&local_1b9);
      NumToString<unsigned_short>(&local_1e0,(s->value).offset);
      CodeWriter::SetValue((CodeWriter *)ppFVar2,&local_1b8,&local_1e0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::allocator<char>::~allocator(&local_1b9);
      ppFVar2 = fields_vec.
                super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_200,"return_type",&local_201);
      CodeWriter::SetValue((CodeWriter *)ppFVar2,&local_200,(string *)((long)&bbgetter.field_2 + 8))
      ;
      std::__cxx11::string::~string((string *)&local_200);
      std::allocator<char>::~allocator(&local_201);
      ppFVar2 = fields_vec.
                super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_228,"field_type",&local_229);
      CodeWriter::SetValue
                ((CodeWriter *)ppFVar2,&local_228,(string *)((long)&field_default_value.field_2 + 8)
                );
      std::__cxx11::string::~string((string *)&local_228);
      std::allocator<char>::~allocator(&local_229);
      ppFVar2 = fields_vec.
                super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_250,"field_name",&local_251);
      CodeWriter::SetValue
                ((CodeWriter *)ppFVar2,&local_250,(string *)((long)&field_type.field_2 + 8));
      std::__cxx11::string::~string((string *)&local_250);
      std::allocator<char>::~allocator(&local_251);
      ppFVar2 = fields_vec.
                super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_278,"field_default",&local_279);
      CodeWriter::SetValue
                ((CodeWriter *)ppFVar2,&local_278,(string *)((long)&return_type.field_2 + 8));
      std::__cxx11::string::~string((string *)&local_278);
      std::allocator<char>::~allocator(&local_279);
      ppFVar2 = fields_vec.
                super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"bbgetter",&local_2a1)
      ;
      CodeWriter::SetValue((CodeWriter *)ppFVar2,&local_2a0,(string *)local_108);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::allocator<char>::~allocator(&local_2a1);
      ppFVar2 = fields_vec.
                super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (local_194 == BASE_TYPE_STRUCT) {
        local_2d0.writer =
             (CodeWriter *)
             fields_vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::function<void()>::
        function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_1_,void>
                  ((function<void()> *)&local_2c8,&local_2d0);
        GenerateGetterOneLine
                  ((CodeWriter *)ppFVar2,(string *)((long)&field_type.field_2 + 8),
                   (string *)((long)&bbgetter.field_2 + 8),&local_2c8);
        std::function<void_()>::~function(&local_2c8);
      }
      else if ((local_194 == BASE_TYPE_VECTOR) && ((s->value).type.element == BASE_TYPE_STRUCT)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"j: Int",&local_2f1)
        ;
        local_320.writer =
             (CodeWriter *)
             fields_vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::function<void()>::
        function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_2_,void>
                  ((function<void()> *)&local_318,&local_320);
        GenerateFunOneLine((CodeWriter *)ppFVar2,(string *)((long)&field_type.field_2 + 8),
                           &local_2f0,(string *)((long)&bbgetter.field_2 + 8),&local_318,false);
        std::function<void_()>::~function(&local_318);
        std::__cxx11::string::~string((string *)&local_2f0);
        std::allocator<char>::~allocator(&local_2f1);
      }
      bVar3 = IsScalar(local_194);
      ppFVar2 = fields_vec.
                super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (bVar3) {
        if ((struct_def->fixed & 1U) == 0) {
          local_398.writer =
               (CodeWriter *)
               fields_vec.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_398.offset_val = (string *)((long)&offset_prefix.field_2 + 8);
          local_398.this = this;
          local_398.field = s;
          std::function<void()>::
          function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_4_,void>
                    ((function<void()> *)&local_378,&local_398);
          GenerateGetterOneLine
                    ((CodeWriter *)ppFVar2,(string *)((long)&field_type.field_2 + 8),
                     (string *)((long)&bbgetter.field_2 + 8),&local_378);
          std::function<void_()>::~function(&local_378);
        }
        else {
          local_358.writer =
               (CodeWriter *)
               fields_vec.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_358.this = this;
          local_358.field = s;
          std::function<void()>::
          function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_3_,void>
                    ((function<void()> *)&local_340,&local_358);
          GenerateGetterOneLine
                    ((CodeWriter *)ppFVar2,(string *)((long)&field_type.field_2 + 8),
                     (string *)((long)&bbgetter.field_2 + 8),&local_340);
          std::function<void_()>::~function(&local_340);
        }
      }
      else {
        switch(local_194) {
        case BASE_TYPE_STRING:
          vectortype._24_8_ =
               fields_vec.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          std::function<void()>::
          function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_7_,void>
                    ((function<void()> *)&local_458,
                     (anon_class_16_2_97156e7b *)&vectortype.fixed_length);
          GenerateGetterOneLine
                    ((CodeWriter *)ppFVar2,(string *)((long)&field_type.field_2 + 8),
                     (string *)((long)&bbgetter.field_2 + 8),&local_458);
          std::function<void_()>::~function(&local_458);
          break;
        case BASE_TYPE_VECTOR:
          Type::VectorType((Type *)((long)&params.field_2 + 8),&(s->value).type);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_4a8,"j: Int",&local_4a9);
          std::allocator<char>::~allocator(&local_4a9);
          if ((params.field_2._8_4_ == 0xf) || (params.field_2._8_4_ == 0x10)) {
            std::operator+(&local_4f0,"obj: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&field_default_value.field_2 + 8));
            std::operator+(&local_4d0,&local_4f0,", j: Int");
            std::__cxx11::string::operator=((string *)local_4a8,(string *)&local_4d0);
            std::__cxx11::string::~string((string *)&local_4d0);
            std::__cxx11::string::~string((string *)&local_4f0);
          }
          ppFVar2 = fields_vec.
                    super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_528.vectortype = (Type *)((long)&params.field_2 + 8);
          local_528.writer =
               (CodeWriter *)
               fields_vec.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_528.offset_val = (string *)((long)&offset_prefix.field_2 + 8);
          std::function<void()>::
          function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_8_,void>
                    ((function<void()> *)&local_510,&local_528);
          GenerateFunOneLine((CodeWriter *)ppFVar2,(string *)((long)&field_type.field_2 + 8),
                             (string *)local_4a8,(string *)((long)&bbgetter.field_2 + 8),&local_510,
                             false);
          std::function<void_()>::~function(&local_510);
          std::__cxx11::string::~string((string *)local_4a8);
          break;
        case BASE_TYPE_STRUCT:
          if ((struct_def->fixed & 1U) == 0) {
            std::operator+(&local_400,"obj: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&field_default_value.field_2 + 8));
            local_438.writer =
                 (CodeWriter *)
                 fields_vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_438.offset_val = (string *)((long)&offset_prefix.field_2 + 8);
            local_438.field = s;
            std::function<void()>::
            function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_6_,void>
                      ((function<void()> *)&local_420,&local_438);
            GenerateFunOneLine((CodeWriter *)ppFVar2,(string *)((long)&field_type.field_2 + 8),
                               &local_400,(string *)((long)&bbgetter.field_2 + 8),&local_420,false);
            std::function<void_()>::~function(&local_420);
            std::__cxx11::string::~string((string *)&local_400);
          }
          else {
            std::operator+(&local_3b8,"obj: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&field_default_value.field_2 + 8));
            local_3e0.writer =
                 (CodeWriter *)
                 fields_vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            std::function<void()>::
            function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_5_,void>
                      ((function<void()> *)&local_3d8,&local_3e0);
            GenerateFunOneLine((CodeWriter *)ppFVar2,(string *)((long)&field_type.field_2 + 8),
                               &local_3b8,(string *)((long)&bbgetter.field_2 + 8),&local_3d8,false);
            std::function<void_()>::~function(&local_3d8);
            std::__cxx11::string::~string((string *)&local_3b8);
          }
          break;
        case BASE_TYPE_UNION:
          std::operator+(&local_548,"obj: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&field_default_value.field_2 + 8));
          local_580.writer =
               (CodeWriter *)
               fields_vec.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_580.offset_val = (string *)((long)&offset_prefix.field_2 + 8);
          local_580.bbgetter = (string *)local_108;
          std::function<void()>::
          function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_9_,void>
                    ((function<void()> *)&local_568,&local_580);
          GenerateFunOneLine((CodeWriter *)ppFVar2,(string *)((long)&field_type.field_2 + 8),
                             &local_548,(string *)((long)&bbgetter.field_2 + 8),&local_568,false);
          std::function<void_()>::~function(&local_568);
          std::__cxx11::string::~string((string *)&local_548);
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp"
                        ,0x48d,
                        "void flatbuffers::kotlin::KotlinKMPGenerator::GenerateStructGetters(StructDef &, CodeWriter &) const"
                       );
        }
      }
      ppFVar2 = fields_vec.
                super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (local_194 == BASE_TYPE_VECTOR) {
        std::operator+(&local_5a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&field_type.field_2 + 8),"Length");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_5c0,"Int",&local_5c1);
        sd = (StructDef *)
             fields_vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_5f0 = (string *)((long)&offset_prefix.field_2 + 8);
        std::function<void()>::
        function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_10_,void>
                  ((function<void()> *)&local_5e8,(anon_class_16_2_97156e7b *)&sd);
        GenerateGetterOneLine((CodeWriter *)ppFVar2,&local_5a0,&local_5c0,&local_5e8);
        std::function<void_()>::~function(&local_5e8);
        std::__cxx11::string::~string((string *)&local_5c0);
        std::allocator<char>::~allocator(&local_5c1);
        std::__cxx11::string::~string((string *)&local_5a0);
        if (((s->value).type.element == BASE_TYPE_STRUCT) &&
           ((((s->value).type.struct_def)->fixed & 1U) == 0)) {
          pSVar1 = (s->value).type.struct_def;
          kit._M_current = (FieldDef **)&(pSVar1->fields).vec;
          local_610._M_current =
               (FieldDef **)
               std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                         ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                           *)kit._M_current);
          while( true ) {
            kfield = (FieldDef *)
                     std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                     ::end((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                            *)kit._M_current);
            bVar3 = __gnu_cxx::operator!=
                              (&local_610,
                               (__normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                                *)&kfield);
            if (!bVar3) break;
            ppFVar5 = __gnu_cxx::
                      __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                      ::operator*(&local_610);
            qualified_name.field_2._8_8_ = *ppFVar5;
            if ((((FieldDef *)qualified_name.field_2._8_8_)->key & 1U) != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_660,"",
                         (allocator<char> *)(name.field_2._M_local_buf + 0xf));
              TypeInNameSpace((string *)local_640,this,&pSVar1->super_Definition,&local_660);
              std::__cxx11::string::~string((string *)&local_660);
              std::allocator<char>::~allocator((allocator<char> *)(name.field_2._M_local_buf + 0xf))
              ;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_6a8,"ByKey",
                         (allocator<char> *)(params_1.field_2._M_local_buf + 0xf));
              IdlNamer::Method((string *)local_688,&this->namer_,s,&local_6a8);
              std::__cxx11::string::~string((string *)&local_6a8);
              std::allocator<char>::~allocator
                        ((allocator<char> *)(params_1.field_2._M_local_buf + 0xf));
              GenTypeGet_abi_cxx11_
                        ((string *)((long)&rtype.field_2 + 8),this,
                         (Type *)(qualified_name.field_2._8_8_ + 200));
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_6d0,"key: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&rtype.field_2 + 8));
              std::__cxx11::string::~string((string *)(rtype.field_2._M_local_buf + 8));
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_710,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_640,"?");
              ppFVar2 = fields_vec.
                        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              param2.field_2._8_8_ =
                   fields_vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              std::function<void()>::
              function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_11_,void>
                        ((function<void()> *)&local_730,
                         (anon_class_24_3_aa68e553 *)((long)&param2.field_2 + 8));
              GenerateFunOneLine((CodeWriter *)ppFVar2,(string *)local_688,(string *)local_6d0,
                                 (string *)local_710,&local_730,false);
              std::function<void_()>::~function(&local_730);
              std::operator+(&local_7a8,"obj: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_640);
              std::operator+(&local_788,&local_7a8,", key: ");
              GenTypeGet_abi_cxx11_(&local_7c8,this,(Type *)(qualified_name.field_2._8_8_ + 200));
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_768,&local_788,&local_7c8);
              std::__cxx11::string::~string((string *)&local_7c8);
              std::__cxx11::string::~string((string *)&local_788);
              std::__cxx11::string::~string((string *)&local_7a8);
              ppFVar2 = fields_vec.
                        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_800.writer =
                   (CodeWriter *)
                   fields_vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_800.offset_val = (string *)((long)&offset_prefix.field_2 + 8);
              local_800.qualified_name = (string *)local_640;
              std::function<void()>::
              function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_12_,void>
                        ((function<void()> *)&local_7e8,&local_800);
              GenerateFunOneLine((CodeWriter *)ppFVar2,(string *)local_688,(string *)local_768,
                                 (string *)local_710,&local_7e8,false);
              std::function<void_()>::~function(&local_7e8);
              std::__cxx11::string::~string((string *)local_768);
              std::__cxx11::string::~string((string *)local_710);
              std::__cxx11::string::~string((string *)local_6d0);
              std::__cxx11::string::~string((string *)local_688);
              std::__cxx11::string::~string((string *)local_640);
              break;
            }
            __gnu_cxx::
            __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
            ::operator++(&local_610);
          }
        }
      }
      if (local_194 == BASE_TYPE_VECTOR) {
        Type::VectorType((Type *)((long)&end_idx.field_2 + 8),&(s->value).type);
        bVar4 = IsScalar(end_idx.field_2._8_4_);
        bVar3 = true;
        if (!bVar4) goto LAB_00271761;
      }
      else {
LAB_00271761:
        bVar3 = local_194 == BASE_TYPE_STRING;
      }
      if (bVar3) {
        if (local_194 == BASE_TYPE_STRING) {
          local_c88 = 1;
        }
        else {
          Type::VectorType(&local_860,&(s->value).type);
          local_c88 = InlineSize(&local_860);
        }
        NumToString<unsigned_long>((string *)local_840,local_c88);
        ppFVar2 = fields_vec.
                  super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::operator+(&local_880,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&field_type.field_2 + 8),"AsBuffer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_8a0,"",&local_8a1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_8c8,"ReadBuffer",&local_8c9);
        nested_type_name.field_2._8_8_ =
             fields_vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::function<void()>::
        function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_13_,void>
                  ((function<void()> *)&local_8f0,
                   (anon_class_16_2_a89c3491 *)((long)&nested_type_name.field_2 + 8));
        GenerateFunOneLine((CodeWriter *)ppFVar2,&local_880,&local_8a0,&local_8c8,&local_8f0,false);
        std::function<void_()>::~function(&local_8f0);
        std::__cxx11::string::~string((string *)&local_8c8);
        std::allocator<char>::~allocator(&local_8c9);
        std::__cxx11::string::~string((string *)&local_8a0);
        std::allocator<char>::~allocator(&local_8a1);
        std::__cxx11::string::~string((string *)&local_880);
        std::__cxx11::string::~string((string *)local_840);
      }
      if (s->nested_flatbuffer != (StructDef *)0x0) {
        pSVar1 = s->nested_flatbuffer;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_940,"",
                   (allocator<char> *)(nested_method_name.field_2._M_local_buf + 0xf));
        TypeInNameSpace((string *)local_920,this,&pSVar1->super_Definition,&local_940);
        std::__cxx11::string::~string((string *)&local_940);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(nested_method_name.field_2._M_local_buf + 0xf));
        std::operator+(&local_988,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&field_type.field_2 + 8),"As");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_968,&local_988,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       s->nested_flatbuffer);
        std::__cxx11::string::~string((string *)&local_988);
        ppFVar2 = fields_vec.
                  super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::operator+(&local_9a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_920,"?");
        local_9e0.writer =
             (CodeWriter *)
             fields_vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_9e0.nested_method_name =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_968;
        local_9e0.nested_type_name = (string *)local_920;
        std::function<void()>::
        function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_14_,void>
                  ((function<void()> *)&local_9c8,&local_9e0);
        GenerateGetterOneLine((CodeWriter *)ppFVar2,(string *)local_968,&local_9a8,&local_9c8);
        std::function<void_()>::~function(&local_9c8);
        std::__cxx11::string::~string((string *)&local_9a8);
        ppFVar2 = fields_vec.
                  super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::operator+(&local_a00,"obj: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_920);
        std::operator+(&local_a20,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_920,"?");
        local_a50.writer =
             (CodeWriter *)
             fields_vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_a50.offset_val = (string *)((long)&offset_prefix.field_2 + 8);
        std::function<void()>::
        function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateStructGetters(flatbuffers::StructDef&,flatbuffers::CodeWriter&)const::_lambda()_15_,void>
                  ((function<void()> *)&local_a40,&local_a50);
        GenerateFunOneLine((CodeWriter *)ppFVar2,(string *)local_968,&local_a00,&local_a20,
                           &local_a40,false);
        std::function<void_()>::~function(&local_a40);
        std::__cxx11::string::~string((string *)&local_a20);
        std::__cxx11::string::~string((string *)&local_a00);
        std::__cxx11::string::~string((string *)local_968);
        std::__cxx11::string::~string((string *)local_920);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a70,"",&local_a71);
      CodeWriter::operator+=
                ((CodeWriter *)
                 fields_vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_a70);
      std::__cxx11::string::~string((string *)&local_a70);
      std::allocator<char>::~allocator(&local_a71);
      std::__cxx11::string::~string((string *)local_170);
      std::__cxx11::string::~string((string *)(offset_prefix.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_108);
      std::__cxx11::string::~string((string *)(bbgetter.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(return_type.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(field_default_value.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(field_type.field_2._M_local_buf + 8));
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_48);
  } while( true );
}

Assistant:

void GenerateStructGetters(StructDef &struct_def, CodeWriter &writer) const {
    auto fields_vec = struct_def.fields.vec;
    FieldDef *key_field = nullptr;
    for (auto it = fields_vec.begin(); it != fields_vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;
      if (field.key) key_field = &field;

      GenerateComment(field.doc_comment, writer, &comment_config);

      auto field_name = namer_.Field(field);
      auto field_type = GenTypeGet(field.value.type);
      auto field_default_value = GenDefaultValue(field);
      auto return_type = GetterReturnType(field);
      auto bbgetter = ByteBufferGetter(field.value.type, "bb");
      auto offset_val = NumToString(field.value.offset);
      auto offset_prefix =
          "val o = offset(" + offset_val + "); return o != 0 ? ";
      auto value_base_type = field.value.type.base_type;
      // Most field accessors need to retrieve and test the field offset
      // first, this is the offset value for that:
      writer.SetValue("offset", NumToString(field.value.offset));
      writer.SetValue("return_type", return_type);
      writer.SetValue("field_type", field_type);
      writer.SetValue("field_name", field_name);
      writer.SetValue("field_default", field_default_value);
      writer.SetValue("bbgetter", bbgetter);
      // Generate the accessors that don't do object reuse.
      if (value_base_type == BASE_TYPE_STRUCT) {
        // Calls the accessor that takes an accessor object with a
        // new object.
        // val pos
        //     get() = pos(Vec3())
        GenerateGetterOneLine(writer, field_name, return_type, [&]() {
          writer += "{{field_name}}({{field_type}}())";
        });
      } else if (value_base_type == BASE_TYPE_VECTOR &&
                 field.value.type.element == BASE_TYPE_STRUCT) {
        // Accessors for vectors of structs also take accessor objects,
        // this generates a variant without that argument.
        // ex: fun weapons(j: Int) = weapons(Weapon(), j)
        GenerateFunOneLine(writer, field_name, "j: Int", return_type, [&]() {
          writer += "{{field_name}}({{field_type}}(), j)";
        });
      }

      if (IsScalar(value_base_type)) {
        if (struct_def.fixed) {
          GenerateGetterOneLine(writer, field_name, return_type, [&]() {
            std::string found = "{{bbgetter}}(bufferPos + {{offset}})";
            writer += WrapEnumValue(field.value.type, found);
          });
        } else {
          GenerateGetterOneLine(writer, field_name, return_type, [&]() {
            std::string found = "{{bbgetter}}(it + bufferPos)";
            writer += LookupFieldOneLine(offset_val,
                                         WrapEnumValue(field.value.type, found),
                                         "{{field_default}}");
          });
        }
      } else {
        switch (value_base_type) {
          case BASE_TYPE_STRUCT:
            if (struct_def.fixed) {
              // create getter with object reuse
              // ex:
              // fun pos(obj: Vec3) : Vec3? = obj.init(bufferPos + 4, bb)
              // ? adds nullability annotation
              GenerateFunOneLine(
                  writer, field_name, "obj: " + field_type, return_type, [&]() {
                    writer += "obj.init(bufferPos + {{offset}}, bb)";
                  });
            } else {
              // create getter with object reuse
              // ex:
              //  fun pos(obj: Vec3) : Vec3? {
              //      val o = offset(4)
              //      return if(o != 0) {
              //          obj.init(o + bufferPos, bb)
              //      else {
              //          null
              //      }
              //  }
              // ? adds nullability annotation
              GenerateFunOneLine(
                  writer, field_name, "obj: " + field_type, return_type, [&]() {
                    auto fixed = field.value.type.struct_def->fixed;

                    writer.SetValue("seek", Indirect("it + bufferPos", fixed));
                    writer += LookupFieldOneLine(
                        offset_val, "obj.init({{seek}}, bb)", "null");
                  });
            }
            break;
          case BASE_TYPE_STRING:
            // create string getter
            // e.g.
            // val Name : String?
            //     get() = {
            //         val o = offset(10)
            //         return if (o != 0) string(o + bufferPos) else null
            //     }
            // ? adds nullability annotation
            GenerateGetterOneLine(writer, field_name, return_type, [&]() {
              writer += LookupFieldOneLine(offset_val, "string(it + bufferPos)",
                                           "null");
            });
            break;
          case BASE_TYPE_VECTOR: {
            // e.g.
            // fun inventory(j: Int) : UByte {
            //     val o = offset(14)
            //     return if (o != 0) {
            //         bb.get(vector(it) + j * 1).toUByte()
            //     } else {
            //        0
            //     }
            // }

            auto vectortype = field.value.type.VectorType();
            std::string params = "j: Int";

            if (vectortype.base_type == BASE_TYPE_STRUCT ||
                vectortype.base_type == BASE_TYPE_UNION) {
              params = "obj: " + field_type + ", j: Int";
            }

            GenerateFunOneLine(writer, field_name, params, return_type, [&]() {
              auto inline_size = NumToString(InlineSize(vectortype));
              auto index = "vector(it) + j * " + inline_size;
              std::string found = "";
              writer.SetValue("index", index);

              if (IsEnum(vectortype)) {
                found = "{{field_type}}({{bbgetter}}({{index}}))";
              } else {
                switch (vectortype.base_type) {
                  case BASE_TYPE_STRUCT: {
                    bool fixed = vectortype.struct_def->fixed;
                    writer.SetValue("index", Indirect(index, fixed));
                    found = "obj.init({{index}}, bb)";
                    break;
                  }
                  case BASE_TYPE_UNION:
                    found = "{{bbgetter}}(obj, {{index}})";
                    break;
                  case BASE_TYPE_UTYPE:
                    found = "{{field_type}}({{bbgetter}}({{index}}))";
                    break;
                  default: found = "{{bbgetter}}({{index}})";
                }
              }
              writer +=
                  LookupFieldOneLine(offset_val, found, "{{field_default}}");
            });
            break;
          }
          case BASE_TYPE_UNION:
            GenerateFunOneLine(
                writer, field_name, "obj: " + field_type, return_type, [&]() {
                  writer += LookupFieldOneLine(
                      offset_val, bbgetter + "(obj, it + bufferPos)", "null");
                });
            break;
          default: FLATBUFFERS_ASSERT(0);
        }
      }

      if (value_base_type == BASE_TYPE_VECTOR) {
        // Generate Lenght functions for vectors
        GenerateGetterOneLine(writer, field_name + "Length", "Int", [&]() {
          writer += LookupFieldOneLine(offset_val, "vectorLength(it)", "0");
        });

        // See if we should generate a by-key accessor.
        if (field.value.type.element == BASE_TYPE_STRUCT &&
            !field.value.type.struct_def->fixed) {
          auto &sd = *field.value.type.struct_def;
          auto &fields = sd.fields.vec;
          for (auto kit = fields.begin(); kit != fields.end(); ++kit) {
            auto &kfield = **kit;
            if (kfield.key) {
              auto qualified_name = TypeInNameSpace(sd);
              auto name = namer_.Method(field, "ByKey");
              auto params = "key: " + GenTypeGet(kfield.value.type);
              auto rtype = qualified_name + "?";
              GenerateFunOneLine(writer, name, params, rtype, [&]() {
                writer += LookupFieldOneLine(
                    offset_val,
                    qualified_name + ".lookupByKey(null, vector(it), key, bb)",
                    "null");
              });

              auto param2 = "obj: " + qualified_name +
                            ", key: " + GenTypeGet(kfield.value.type);
              GenerateFunOneLine(writer, name, param2, rtype, [&]() {
                writer += LookupFieldOneLine(
                    offset_val,
                    qualified_name + ".lookupByKey(obj, vector(it), key, bb)",
                    "null");
              });

              break;
            }
          }
        }
      }

      if ((value_base_type == BASE_TYPE_VECTOR &&
           IsScalar(field.value.type.VectorType().base_type)) ||
          value_base_type == BASE_TYPE_STRING) {
        auto end_idx =
            NumToString(value_base_type == BASE_TYPE_STRING
                            ? 1
                            : InlineSize(field.value.type.VectorType()));

        // Generate a ByteBuffer accessor for strings & vectors of scalars.
        // e.g.
        // fun inventoryInByteBuffer(buffer: Bytebuffer):
        //     ByteBuffer = vectorAsBuffer(buffer, 14, 1)
        GenerateFunOneLine(
            writer, field_name + "AsBuffer", "", "ReadBuffer", [&]() {
              writer.SetValue("end", end_idx);
              writer += "vectorAsBuffer(bb, {{offset}}, {{end}})";
            });
      }

      // generate object accessors if is nested_flatbuffer
      // fun testnestedflatbufferAsMonster() : Monster?
      //{ return testnestedflatbufferAsMonster(new Monster()); }

      if (field.nested_flatbuffer) {
        auto nested_type_name = TypeInNameSpace(*field.nested_flatbuffer);
        auto nested_method_name =
            field_name + "As" + field.nested_flatbuffer->name;

        GenerateGetterOneLine(
            writer, nested_method_name, nested_type_name + "?", [&]() {
              writer += nested_method_name + "(" + nested_type_name + "())";
            });

        GenerateFunOneLine(
            writer, nested_method_name, "obj: " + nested_type_name,
            nested_type_name + "?", [&]() {
              writer += LookupFieldOneLine(
                  offset_val, "obj.init(indirect(vector(it)), bb)", "null");
            });
      }

      writer += "";  // Initial line break between fields
    }
    if (struct_def.has_key && !struct_def.fixed) {
      // Key Comparison method
      GenerateOverrideFun(
          writer, "keysCompare",
          "o1: Offset<*>, o2: Offset<*>, buffer: ReadWriteBuffer", "Int",
          [&]() {
            if (IsString(key_field->value.type)) {
              writer.SetValue("offset", NumToString(key_field->value.offset));
              writer +=
                  " return compareStrings(offset({{offset}}, o1, "
                  "buffer), offset({{offset}}, o2, buffer), buffer)";

            } else {
              auto getter1 = GenLookupByKey(key_field, "buffer", "o1");
              auto getter2 = GenLookupByKey(key_field, "buffer", "o2");
              writer += "val a = " + getter1;
              writer += "val b = " + getter2;
              writer += "return (a - b).toInt().sign()";
            }
          });
    }
  }